

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_inet.c
# Opt level: O2

in_addr_t ngx_inet_addr(u_char *text,size_t len)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  byte *pbVar6;
  ulong uVar7;
  
  pbVar6 = text + len;
  iVar3 = 0;
  uVar7 = 0;
  lVar5 = 0;
  for (; iVar2 = (int)uVar7, text < pbVar6; text = text + 1) {
    bVar1 = *text;
    if ((byte)(bVar1 - 0x30) < 10) {
      uVar7 = (ulong)(bVar1 & 0xf) + uVar7 * 10;
      if (0xff < uVar7) goto LAB_00118650;
    }
    else {
      if (bVar1 != 0x2e) goto LAB_00118650;
      iVar3 = iVar2 + iVar3 * 0x100;
      lVar5 = lVar5 + 1;
      uVar7 = 0;
    }
  }
  if (lVar5 == 3) {
    uVar4 = iVar2 + iVar3 * 0x100;
    uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | iVar2 * 0x1000000;
  }
  else {
LAB_00118650:
    uVar4 = 0xffffffff;
  }
  return uVar4;
}

Assistant:

in_addr_t
ngx_inet_addr(u_char *text, size_t len)
{
    u_char      *p, c;
    in_addr_t    addr;
    ngx_uint_t   octet, n;

    addr = 0;
    octet = 0;
    n = 0;

    for (p = text; p < text + len; p++) {
        c = *p;

        if (c >= '0' && c <= '9') {
            octet = octet * 10 + (c - '0');

            if (octet > 255) {
                return INADDR_NONE;
            }

            continue;
        }

        if (c == '.') {
            addr = (addr << 8) + octet;
            octet = 0;
            n++;
            continue;
        }

        return INADDR_NONE;
    }

    if (n == 3) {
        addr = (addr << 8) + octet;
        return htonl(addr);
    }

    return INADDR_NONE;
}